

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O2

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  __type _Var1;
  bool bVar2;
  char cVar3;
  int extraout_EAX;
  ostream *poVar4;
  runtime_error *this;
  ApprovalMismatchException *this_00;
  pointer_____offset_0x10___ *ppuVar5;
  string asStack_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  stringstream s;
  ostream local_198 [376];
  
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             sig);
  if (_Var1) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&s);
    poVar4 = ::std::operator<<(local_198,"Identical filenames for received and approved.\n");
    poVar4 = ::std::operator<<(poVar4,"Tests would spuriously pass. \n");
    poVar4 = ::std::operator<<(poVar4,"Please check your custom namer. \n");
    poVar4 = ::std::operator<<(poVar4,"Received : \"");
    poVar4 = ::std::operator<<(poVar4,(string *)ctx);
    poVar4 = ::std::operator<<(poVar4,"\" \n");
    poVar4 = ::std::operator<<(poVar4,"Approved : \"");
    poVar4 = ::std::operator<<(poVar4,(string *)sig);
    ::std::operator<<(poVar4,"\"");
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringbuf::str();
    ::std::runtime_error::runtime_error(this,local_1c8);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar2 = FileUtils::fileExists((string *)sig);
  if (bVar2) {
    bVar2 = FileUtils::fileExists((string *)ctx);
    if (bVar2) {
      ::std::__cxx11::string::string
                (local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx)
      ;
      ::std::__cxx11::string::string
                (asStack_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sig);
      cVar3 = (**(code **)(*(long *)siglen + 0x10))(siglen,local_1e8,asStack_208);
      ::std::__cxx11::string::~string(asStack_208);
      ::std::__cxx11::string::~string(local_1e8);
      if (cVar3 != '\0') {
        return extraout_EAX;
      }
      this_00 = (ApprovalMismatchException *)__cxa_allocate_exception(0x28);
      ApprovalMismatchException::ApprovalMismatchException(this_00,(string *)ctx,(string *)sig);
      ppuVar5 = &ApprovalMismatchException::typeinfo;
      goto LAB_0010d929;
    }
    this_00 = (ApprovalMismatchException *)__cxa_allocate_exception(0x28);
    ApprovalMissingException::ApprovalMissingException
              ((ApprovalMissingException *)this_00,(string *)sig,(string *)ctx);
  }
  else {
    this_00 = (ApprovalMismatchException *)__cxa_allocate_exception(0x28);
    ApprovalMissingException::ApprovalMissingException
              ((ApprovalMissingException *)this_00,(string *)ctx,(string *)sig);
  }
  ppuVar5 = &ApprovalMissingException::typeinfo;
LAB_0010d929:
  __cxa_throw(this_00,ppuVar5,ApprovalException::~ApprovalException);
}

Assistant:

void FileApprover::verify(const std::string& receivedPath,
                              const std::string& approvedPath,
                              const ApprovalComparator& comparator)
    {
        if (receivedPath == approvedPath)
        {
            std::stringstream s;
            s << "Identical filenames for received and approved.\n"
              << "Tests would spuriously pass. \n"
              << "Please check your custom namer. \n"
              << "Received : \"" << receivedPath << "\" \n"
              << "Approved : \"" << approvedPath << "\"";
            // Do not throw ApprovalException, as we don't want reporters to trigger.
            // They would show two seemingly identical files, due to matching file name.
            throw std::runtime_error(s.str());
        }

        if (!FileUtils::fileExists(approvedPath))
        {
            throw ApprovalMissingException(receivedPath, approvedPath);
        }

        if (!FileUtils::fileExists(receivedPath))
        {
            throw ApprovalMissingException(approvedPath, receivedPath);
        }

        if (!comparator.contentsAreEquivalent(receivedPath, approvedPath))
        {
            throw ApprovalMismatchException(receivedPath, approvedPath);
        }
    }